

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O2

TestStatus * __thiscall
vkt::FunctionInstance1<vkt::SpirVAssembly::InstanceContext>::iterate
          (TestStatus *__return_storage_ptr__,
          FunctionInstance1<vkt::SpirVAssembly::InstanceContext> *this)

{
  Context *pCVar1;
  Function p_Var2;
  InstanceContext in_stack_fffffffffffffef8;
  
  pCVar1 = (this->super_TestInstance).m_context;
  p_Var2 = (this->m_args).func;
  SpirVAssembly::InstanceContext::InstanceContext
            ((InstanceContext *)&stack0xffffffffffffff00,&(this->m_args).arg0);
  (*p_Var2)(__return_storage_ptr__,pCVar1,in_stack_fffffffffffffef8);
  SpirVAssembly::InstanceContext::~InstanceContext((InstanceContext *)&stack0xffffffffffffff00);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	iterate				(void) { return m_args.func(m_context, m_args.arg0); }